

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall
cmDocumentation::CheckOptions(cmDocumentation *this,int argc,char **argv,char *exitOpt)

{
  cmDocumentation *s;
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  cmDocumentation *pcVar5;
  cmDocumentation *pcVar6;
  int iVar7;
  int iVar8;
  bool result;
  RequestedHelpItem help;
  bool local_b1;
  char **local_b0;
  string local_a8;
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
  *local_88;
  undefined1 local_80 [8];
  string local_78;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char *local_38;
  
  local_b0 = argv;
  if (argc == 1) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_80._0_4_ = Usage;
    local_78._M_dataplus._M_p = local_80 + 0x18;
    local_58._M_p = (pointer)&local_48;
    std::
    vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
    ::emplace_back<cmDocumentation::RequestedHelpItem>
              (&this->RequestedHelpItems,(RequestedHelpItem *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    if (local_78._M_dataplus._M_p != local_80 + 0x18) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
LAB_0018c90c:
    local_b1 = true;
  }
  else {
    local_b1 = false;
    if (argc < 2) {
      local_b1 = false;
    }
    else {
      s = (cmDocumentation *)(local_80 + 0x28);
      local_88 = &this->RequestedHelpItems;
      iVar7 = 1;
      local_38 = exitOpt;
      do {
        pcVar6 = (cmDocumentation *)local_b0[iVar7];
        if ((local_38 != (char *)0x0) && (iVar4 = strcmp((char *)pcVar6,local_38), iVar4 == 0))
        break;
        local_80._0_4_ = None;
        local_78._M_dataplus._M_p = local_80 + 0x18;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_58._M_p = (pointer)&local_48;
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        iVar4 = strcmp((char *)pcVar6,"-help");
        if ((iVar4 == 0) || (iVar4 = strcmp((char *)pcVar6,"--help"), iVar4 == 0)) {
LAB_0018cce0:
          local_80._0_4_ = Help;
          iVar4 = iVar7 + 1;
          if (iVar4 < argc) {
            pcVar1 = local_b0[iVar4];
            if ((*pcVar1 != '-') &&
               (((*pcVar1 != '/' || ((pcVar1[1] != '?' && (pcVar1[1] != 'V')))) ||
                (pcVar1[2] != '\0')))) {
              strlen(pcVar1);
              std::__cxx11::string::_M_replace((ulong)s,0,(char *)0x0,(ulong)pcVar1);
              iVar7 = iVar4;
            }
          }
          cmsys::SystemTools::LowerCase(&local_a8,(string *)s);
          std::__cxx11::string::operator=((string *)s,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_50 != 0) {
            local_80._0_4_ = OneCommand;
            goto LAB_0018d17b;
          }
LAB_0018d174:
          if (local_80._0_4_ == None) {
            bVar3 = true;
          }
          else {
LAB_0018d17b:
            local_b1 = true;
            bVar3 = true;
            std::
            vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
            ::emplace_back<cmDocumentation::RequestedHelpItem>
                      (local_88,(RequestedHelpItem *)local_80);
          }
        }
        else {
          bVar3 = pcVar6->ShowGenerators;
          if (bVar3 == true) {
            if (((pcVar6->field_0x1 == '?') && (pcVar6->field_0x2 == '\0')) ||
               (iVar4 = strcmp((char *)pcVar6,"-usage"), iVar4 == 0)) goto LAB_0018cce0;
          }
          else {
            iVar4 = strcmp((char *)pcVar6,"-usage");
            if ((iVar4 == 0) ||
               ((bVar3 == true &&
                (((pcVar6->field_0x1 == 'h' && (pcVar6->field_0x2 == '\0')) ||
                 ((pcVar6->field_0x1 == 'H' && (pcVar6->field_0x2 == '\0')))))))) goto LAB_0018cce0;
          }
          iVar4 = strcmp((char *)pcVar6,"--help-properties");
          if (iVar4 == 0) {
            local_80._0_4_ = OneManual;
            std::__cxx11::string::_M_replace((ulong)s,0,(char *)0x0,0x4d3b19);
            sVar2 = local_78._M_string_length;
            iVar4 = iVar7 + 1;
            if (iVar4 < argc) {
              pcVar1 = local_b0[iVar4];
              if ((*pcVar1 != '-') &&
                 ((*pcVar1 != '/' ||
                  (((pcVar1[1] != '?' && (pcVar1[1] != 'V')) || (pcVar1[2] != '\0')))))) {
                strlen(pcVar1);
                std::__cxx11::string::_M_replace
                          ((ulong)(local_80 + 8),0,(char *)sVar2,(ulong)pcVar1);
                iVar7 = iVar4;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
            goto LAB_0018d174;
          }
          iVar4 = strcmp((char *)pcVar6,"--help-policies");
          if (iVar4 == 0) {
            local_80._0_4_ = OneManual;
            std::__cxx11::string::_M_replace((ulong)s,0,(char *)0x0,0x4d3b3c);
            sVar2 = local_78._M_string_length;
            iVar4 = iVar7 + 1;
            if (iVar4 < argc) {
              pcVar1 = local_b0[iVar4];
              if ((*pcVar1 != '-') &&
                 (((*pcVar1 != '/' || ((pcVar1[1] != '?' && (pcVar1[1] != 'V')))) ||
                  (pcVar1[2] != '\0')))) {
                strlen(pcVar1);
                std::__cxx11::string::_M_replace
                          ((ulong)(local_80 + 8),0,(char *)sVar2,(ulong)pcVar1);
                iVar7 = iVar4;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
            goto LAB_0018d174;
          }
          iVar4 = strcmp((char *)pcVar6,"--help-variables");
          if (iVar4 == 0) {
            local_80._0_4_ = OneManual;
            std::__cxx11::string::_M_replace((ulong)s,0,(char *)0x0,0x4d3b5e);
            iVar4 = iVar7 + 1;
            if (iVar4 < argc) {
              pcVar1 = local_b0[iVar4];
              if ((*pcVar1 != '-') &&
                 (((*pcVar1 != '/' || ((pcVar1[1] != '?' && (pcVar1[1] != 'V')))) ||
                  (pcVar1[2] != '\0')))) {
                std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                iVar7 = iVar4;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
            goto LAB_0018d174;
          }
          iVar4 = strcmp((char *)pcVar6,"--help-modules");
          if (iVar4 == 0) {
            local_80._0_4_ = OneManual;
            pcVar6 = s;
            std::__cxx11::string::_M_replace((ulong)s,0,(char *)0x0,0x4d3b7f);
            iVar4 = iVar7 + 1;
            if (iVar4 < argc) {
              pcVar1 = local_b0[iVar4];
              bVar3 = IsOption(pcVar6,pcVar1);
              if (!bVar3) {
                std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                iVar7 = iVar4;
              }
            }
            WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
            goto LAB_0018d174;
          }
          pcVar5 = pcVar6;
          iVar4 = strcmp((char *)pcVar6,"--help-custom-modules");
          if (iVar4 != 0) {
            iVar4 = strcmp((char *)pcVar6,"--help-commands");
            if (iVar4 == 0) {
              local_80._0_4_ = OneManual;
              pcVar6 = s;
              std::__cxx11::string::operator=((string *)s,"cmake-commands.7");
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar6,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-compatcommands");
            if (iVar4 == 0) {
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Warning: --help-compatcommands no longer supported",""
                        );
              cmSystemTools::Message(&local_a8,(char *)0x0);
              goto LAB_0018d2af;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-full");
            if (iVar4 == 0) {
              local_80._0_4_ = Full;
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-html");
            if (iVar4 == 0) {
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Warning: --help-html no longer supported","");
              cmSystemTools::Message(&local_a8,(char *)0x0);
LAB_0018d2af:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0018d2cb;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-man");
            if (iVar4 == 0) {
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a8,"Warning: --help-man no longer supported","");
              cmSystemTools::Message(&local_a8,(char *)0x0);
              goto LAB_0018d2af;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-command");
            if (iVar4 == 0) {
              local_80._0_4_ = OneCommand;
              iVar4 = iVar7 + 1;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                  iVar4 = iVar8;
                }
              }
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              cmsys::SystemTools::LowerCase(&local_a8,(string *)s);
              std::__cxx11::string::operator=((string *)s,(string *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-module");
            if (iVar4 == 0) {
              local_80._0_4_ = OneModule;
              iVar4 = iVar7 + 1;
              iVar8 = iVar4;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                }
              }
              if (iVar8 < argc) {
                pcVar1 = local_b0[iVar8];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar8;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-property");
            if (iVar4 == 0) {
              local_80._0_4_ = OneProperty;
              iVar4 = iVar7 + 1;
              iVar8 = iVar4;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                }
              }
              if (iVar8 < argc) {
                pcVar1 = local_b0[iVar8];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar8;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-policy");
            if (iVar4 == 0) {
              local_80._0_4_ = OnePolicy;
              iVar4 = iVar7 + 1;
              iVar8 = iVar4;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                }
              }
              if (iVar8 < argc) {
                pcVar1 = local_b0[iVar8];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar8;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-variable");
            if (iVar4 == 0) {
              local_80._0_4_ = OneVariable;
              iVar4 = iVar7 + 1;
              iVar8 = iVar4;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                }
              }
              if (iVar8 < argc) {
                pcVar1 = local_b0[iVar8];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar8;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-manual");
            if (iVar4 == 0) {
              local_80._0_4_ = OneManual;
              iVar4 = iVar7 + 1;
              iVar8 = iVar4;
              if (iVar4 < argc) {
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  pcVar5 = s;
                  std::__cxx11::string::operator=((string *)s,pcVar1);
                  iVar8 = iVar7 + 2;
                  iVar7 = iVar4;
                }
              }
              if (iVar8 < argc) {
                pcVar1 = local_b0[iVar8];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar8;
                }
              }
              WarnFormFromFilename((RequestedHelpItem *)local_80,&local_b1);
              goto LAB_0018d174;
            }
            pcVar5 = pcVar6;
            iVar4 = strcmp((char *)pcVar6,"--help-command-list");
            if (iVar4 != 0) {
              pcVar5 = pcVar6;
              iVar4 = strcmp((char *)pcVar6,"--help-module-list");
              if (iVar4 == 0) {
                local_80._0_4_ = ListModules;
                iVar4 = iVar7 + 1;
                if (argc <= iVar4) goto LAB_0018d17b;
                pcVar1 = local_b0[iVar4];
                bVar3 = IsOption(pcVar5,pcVar1);
                if (!bVar3) {
                  std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                  iVar7 = iVar4;
                }
              }
              else {
                pcVar5 = pcVar6;
                iVar4 = strcmp((char *)pcVar6,"--help-property-list");
                if (iVar4 == 0) {
                  local_80._0_4_ = ListProperties;
                  iVar4 = iVar7 + 1;
                  if (argc <= iVar4) goto LAB_0018d17b;
                  pcVar1 = local_b0[iVar4];
                  bVar3 = IsOption(pcVar5,pcVar1);
                  if (!bVar3) {
                    std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                    iVar7 = iVar4;
                  }
                }
                else {
                  pcVar5 = pcVar6;
                  iVar4 = strcmp((char *)pcVar6,"--help-variable-list");
                  if (iVar4 == 0) {
                    local_80._0_4_ = ListVariables;
                    iVar4 = iVar7 + 1;
                    if (argc <= iVar4) goto LAB_0018d17b;
                    pcVar1 = local_b0[iVar4];
                    bVar3 = IsOption(pcVar5,pcVar1);
                    if (!bVar3) {
                      std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                      iVar7 = iVar4;
                    }
                  }
                  else {
                    pcVar5 = pcVar6;
                    iVar4 = strcmp((char *)pcVar6,"--help-policy-list");
                    if (iVar4 == 0) {
                      local_80._0_4_ = ListPolicies;
                      iVar4 = iVar7 + 1;
                      if (argc <= iVar4) goto LAB_0018d17b;
                      pcVar1 = local_b0[iVar4];
                      bVar3 = IsOption(pcVar5,pcVar1);
                      if (!bVar3) {
                        std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                        iVar7 = iVar4;
                      }
                    }
                    else {
                      pcVar5 = pcVar6;
                      iVar4 = strcmp((char *)pcVar6,"--help-manual-list");
                      if (iVar4 == 0) {
                        local_80._0_4_ = ListManuals;
                        iVar4 = iVar7 + 1;
                        if (argc <= iVar4) goto LAB_0018d17b;
                        pcVar1 = local_b0[iVar4];
                        bVar3 = IsOption(pcVar5,pcVar1);
                        if (!bVar3) {
                          std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                          iVar7 = iVar4;
                        }
                      }
                      else {
                        pcVar5 = pcVar6;
                        iVar4 = strcmp((char *)pcVar6,"--copyright");
                        if (iVar4 == 0) {
                          iVar4 = iVar7 + 1;
                          if (iVar4 < argc) {
                            pcVar1 = local_b0[iVar4];
                            bVar3 = IsOption(pcVar5,pcVar1);
                            if (!bVar3) {
                              std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                              iVar7 = iVar4;
                            }
                          }
                          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_a8,"Warning: --copyright no longer supported",
                                     "");
                          cmSystemTools::Message(&local_a8,(char *)0x0);
                          goto LAB_0018d2af;
                        }
                        pcVar5 = pcVar6;
                        iVar4 = strcmp((char *)pcVar6,"--version");
                        if (((iVar4 == 0) ||
                            (pcVar5 = pcVar6, iVar4 = strcmp((char *)pcVar6,"-version"), iVar4 == 0)
                            ) || ((bVar3 == true &&
                                  ((pcVar6->field_0x1 == 'V' && (pcVar6->field_0x2 == '\0')))))) {
                          local_80._0_4_ = Version;
                          iVar4 = iVar7 + 1;
                          if (argc <= iVar4) goto LAB_0018d17b;
                          pcVar1 = local_b0[iVar4];
                          bVar3 = IsOption(pcVar5,pcVar1);
                          if (!bVar3) {
                            std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                            iVar7 = iVar4;
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0018d174;
            }
            local_80._0_4_ = ListCommands;
            iVar4 = iVar7 + 1;
            if (iVar4 < argc) {
              pcVar1 = local_b0[iVar4];
              bVar3 = IsOption(pcVar5,pcVar1);
              if (!bVar3) {
                std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
                iVar7 = iVar4;
              }
              goto LAB_0018d174;
            }
            goto LAB_0018d17b;
          }
          iVar4 = iVar7 + 1;
          if (iVar4 < argc) {
            pcVar1 = local_b0[iVar4];
            bVar3 = IsOption(pcVar5,pcVar1);
            if (!bVar3) {
              std::__cxx11::string::operator=((string *)(local_80 + 8),pcVar1);
              iVar7 = iVar4;
            }
          }
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Warning: --help-custom-modules no longer supported","");
          cmSystemTools::Message(&local_a8,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((char *)local_78._M_string_length != (char *)0x0) {
            local_80._0_4_ = OldCustomModules;
            cmsys::SystemTools::GetFilenameName(&local_a8,(string *)(local_80 + 8));
            std::__cxx11::string::operator=((string *)s,(string *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0018d174;
          }
LAB_0018d2cb:
          bVar3 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p != &local_48) {
          operator_delete(local_58._M_p,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
        }
        if (local_78._M_dataplus._M_p != local_80 + 0x18) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar3) goto LAB_0018c90c;
        iVar7 = iVar7 + 1;
      } while (iVar7 < argc);
    }
  }
  return (bool)(local_b1 & 1);
}

Assistant:

bool cmDocumentation::CheckOptions(int argc, const char* const* argv,
                                   const char* exitOpt)
{
  // Providing zero arguments gives usage information.
  if (argc == 1) {
    RequestedHelpItem help;
    help.HelpType = cmDocumentation::Usage;
    this->RequestedHelpItems.push_back(std::move(help));
    return true;
  }

  // Search for supported help options.

  bool result = false;
  for (int i = 1; i < argc; ++i) {
    if (exitOpt && strcmp(argv[i], exitOpt) == 0) {
      return result;
    }
    RequestedHelpItem help;
    // Check if this is a supported help option.
    if ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "--help") == 0) ||
        (strcmp(argv[i], "/?") == 0) || (strcmp(argv[i], "-usage") == 0) ||
        (strcmp(argv[i], "-h") == 0) || (strcmp(argv[i], "-H") == 0)) {
      help.HelpType = cmDocumentation::Help;
      GET_OPT_ARGUMENT(help.Argument);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      // special case for single command
      if (!help.Argument.empty()) {
        help.HelpType = cmDocumentation::OneCommand;
      }
    } else if (strcmp(argv[i], "--help-properties") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-properties.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policies") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-policies.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variables") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-variables.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-modules") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-modules.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-custom-modules") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-custom-modules no longer supported");
      if (help.Filename.empty()) {
        return true;
      }
      // Avoid breaking old project builds completely by at least generating
      // the output file.  Abuse help.Argument to give the file name to
      // PrintOldCustomModules without disrupting our internal API.
      help.HelpType = cmDocumentation::OldCustomModules;
      help.Argument = cmSystemTools::GetFilenameName(help.Filename);
    } else if (strcmp(argv[i], "--help-commands") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      help.Argument = "cmake-commands.7";
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-compatcommands") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message(
        "Warning: --help-compatcommands no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-full") == 0) {
      help.HelpType = cmDocumentation::Full;
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-html") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-html no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-man") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --help-man no longer supported");
      return true;
    } else if (strcmp(argv[i], "--help-command") == 0) {
      help.HelpType = cmDocumentation::OneCommand;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      help.Argument = cmSystemTools::LowerCase(help.Argument);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-module") == 0) {
      help.HelpType = cmDocumentation::OneModule;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-property") == 0) {
      help.HelpType = cmDocumentation::OneProperty;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-policy") == 0) {
      help.HelpType = cmDocumentation::OnePolicy;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-variable") == 0) {
      help.HelpType = cmDocumentation::OneVariable;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-manual") == 0) {
      help.HelpType = cmDocumentation::OneManual;
      GET_OPT_ARGUMENT(help.Argument);
      GET_OPT_ARGUMENT(help.Filename);
      this->WarnFormFromFilename(help, result);
    } else if (strcmp(argv[i], "--help-command-list") == 0) {
      help.HelpType = cmDocumentation::ListCommands;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-module-list") == 0) {
      help.HelpType = cmDocumentation::ListModules;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-property-list") == 0) {
      help.HelpType = cmDocumentation::ListProperties;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-variable-list") == 0) {
      help.HelpType = cmDocumentation::ListVariables;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-policy-list") == 0) {
      help.HelpType = cmDocumentation::ListPolicies;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--help-manual-list") == 0) {
      help.HelpType = cmDocumentation::ListManuals;
      GET_OPT_ARGUMENT(help.Filename);
    } else if (strcmp(argv[i], "--copyright") == 0) {
      GET_OPT_ARGUMENT(help.Filename);
      cmSystemTools::Message("Warning: --copyright no longer supported");
      return true;
    } else if ((strcmp(argv[i], "--version") == 0) ||
               (strcmp(argv[i], "-version") == 0) ||
               (strcmp(argv[i], "/V") == 0)) {
      help.HelpType = cmDocumentation::Version;
      GET_OPT_ARGUMENT(help.Filename);
    }
    if (help.HelpType != None) {
      // This is a help option.  See if there is a file name given.
      result = true;
      this->RequestedHelpItems.push_back(std::move(help));
    }
  }
  return result;
}